

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::OP_InitPropertyScoped
               (FrameDisplay *pScope,PropertyId propertyId,Var newValue,Var defaultInstance,
               ScriptContext *scriptContext)

{
  ushort uVar1;
  _func_int *UNRECOVERED_JUMPTABLE;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  undefined4 *puVar6;
  RecyclableObject *pRVar7;
  uint index;
  
  uVar1 = pScope->length;
  if (uVar1 != 0) {
    index = 0;
    do {
      plVar5 = (long *)FrameDisplay::GetItem(pScope,index);
      iVar4 = (**(code **)(*plVar5 + 0xf8))(plVar5,propertyId,newValue);
      if (iVar4 != 0) {
        return 1;
      }
      index = index + 1;
    } while (uVar1 != index);
  }
  bVar3 = VarIs<Js::RecyclableObject>(defaultInstance);
  if (!bVar3) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0xd0d,"(!TaggedNumber::Is(defaultInstance))",
                                "Root object is an int or tagged float?");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pRVar7 = VarTo<Js::RecyclableObject>(defaultInstance);
  UNRECOVERED_JUMPTABLE =
       (pRVar7->super_FinalizableObject).super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
       [0x1f];
  iVar4 = (*UNRECOVERED_JUMPTABLE)(pRVar7,(ulong)(uint)propertyId,newValue,UNRECOVERED_JUMPTABLE);
  return iVar4;
}

Assistant:

BOOL JavascriptOperators::OP_InitPropertyScoped(FrameDisplay *pScope, PropertyId propertyId, Var newValue, Var defaultInstance, ScriptContext* scriptContext)
    {
        int i;
        int length = pScope->GetLength();
        DynamicObject *obj;

        for (i = 0; i < length; i++)
        {
            obj = (DynamicObject*)pScope->GetItem(i);
            if (obj->InitPropertyScoped(propertyId, newValue))
            {
                return TRUE;
            }
        }

        AssertMsg(!TaggedNumber::Is(defaultInstance), "Root object is an int or tagged float?");
        return VarTo<RecyclableObject>(defaultInstance)->InitPropertyScoped(propertyId, newValue);
    }